

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
gss::innards::HomomorphismSearcher::assignments_as_proof_decisions
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  bool bVar1;
  reference pHVar2;
  undefined8 in_RDX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  HomomorphismAssignmentInformation *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *trail;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *in_stack_ffffffffffffff98;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__args;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  __args = in_RDI;
  local_18 = in_RDX;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x16905a);
  local_28 = local_18;
  local_30._M_current =
       (HomomorphismAssignmentInformation *)
       std::
       vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
       ::begin(in_stack_ffffffffffffff98);
  std::
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  ::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::
                 operator==<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                           ((__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             *)in_stack_ffffffffffffff98), ((bVar1 ^ 0xffU) & 1) != 0) {
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
             ::operator*(&local_30);
    if ((pHVar2->is_decision & 1U) != 0) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int_const&,unsigned_int_const&>
                (in_stack_ffffffffffffffb0,(uint *)__args,(uint *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
    ::operator++(&local_30);
  }
  return __args;
}

Assistant:

auto HomomorphismSearcher::assignments_as_proof_decisions(const HomomorphismAssignments & assignments) const -> vector<pair<int, int>>
{
    vector<pair<int, int>> trail;
    for (auto & a : assignments.values)
        if (a.is_decision)
            trail.emplace_back(a.assignment.pattern_vertex, a.assignment.target_vertex);
    return trail;
}